

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O3

SpatialVector * __thiscall
RigidBodyDynamics::Math::SpatialRigidBodyInertia::operator*
          (SpatialRigidBodyInertia *this,SpatialVector *mv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  SpatialVector *in_RDI;
  
  dVar1 = (mv->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar2 = (mv->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar3 = this->m;
  dVar4 = (this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0];
  dVar6 = (mv->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar7 = (mv->super_Matrix<double,_6,_1,_0,_6,_1>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar8 = this->Iyx;
  dVar9 = this->Izx;
  dVar10 = this->Izy;
  dVar11 = this->Iyy;
  dVar5 = this->Izz;
  dVar12 = (this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
  dVar13 = (this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
  dVar14 = (mv->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  dVar15 = (mv->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (dVar15 * dVar12 - dVar14 * dVar13) + dVar7 * dVar9 + dVar2 * this->Ixx + dVar6 * this->Iyx;
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       (dVar1 * dVar13 - dVar15 * dVar4) + dVar7 * dVar10 + dVar2 * dVar8 + dVar6 * dVar11;
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       (dVar4 * dVar14 - dVar1 * dVar12) + dVar5 * dVar7 + dVar9 * dVar2 + dVar10 * dVar6;
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       dVar3 * dVar1 - (dVar7 * dVar12 - dVar13 * dVar6);
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       dVar3 * dVar14 - (dVar2 * dVar13 - dVar4 * dVar7);
  (in_RDI->super_Matrix<double,_6,_1,_0,_6,_1>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       dVar15 * dVar3 - (dVar4 * dVar6 - dVar2 * dVar12);
  return in_RDI;
}

Assistant:

SpatialVector operator* (const SpatialVector &mv) {
    Vector3d mv_lower (mv[3], mv[4], mv[5]);

    Vector3d res_upper = Vector3d (
        Ixx * mv[0] + Iyx * mv[1] + Izx * mv[2],
        Iyx * mv[0] + Iyy * mv[1] + Izy * mv[2],
        Izx * mv[0] + Izy * mv[1] + Izz * mv[2]
        ) + h.cross(mv_lower);
    Vector3d res_lower = m * mv_lower - h.cross (Vector3d (mv[0], mv[1], mv[2]));

    return SpatialVector (
        res_upper[0], res_upper[1], res_upper[2],
        res_lower[0], res_lower[1], res_lower[2]
        );
  }